

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::TraverseSchema::changeRedefineGroup
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  short *psVar1;
  XMLBuffer *this_00;
  XMLCh XVar2;
  XMLStringPool *pXVar3;
  XMLCh XVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  DOMNode *node;
  undefined4 extraout_var;
  XMLCh *pXVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar9;
  long lVar10;
  XMLCh *pXVar11;
  long lVar12;
  XMLSize_t count;
  int iVar13;
  undefined2 *puVar14;
  
  node = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
  if (node == (DOMNode *)0x0) {
    iVar13 = 0;
  }
  else {
    this_00 = &this->fBuffer;
    iVar13 = 0;
    do {
      iVar5 = (*node->_vptr_DOMNode[0x18])(node);
      pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar5);
      if (pXVar8 != L"annotation") {
        pXVar9 = L"annotation";
        if (pXVar8 == (XMLCh *)0x0) {
LAB_00334fa8:
          if (*pXVar9 == L'\0') goto LAB_0033525c;
        }
        else {
          pXVar9 = L"annotation";
          pXVar11 = pXVar8;
          do {
            XVar4 = *pXVar11;
            if (XVar4 == L'\0') goto LAB_00334fa8;
            pXVar11 = pXVar11 + 1;
            XVar2 = *pXVar9;
            pXVar9 = pXVar9 + 1;
          } while (XVar4 == XVar2);
        }
        if (pXVar8 == redefineChildComponentName) {
LAB_00335025:
          pXVar8 = getElementAttValue(this,(DOMElement *)node,L"ref",QName);
          if ((pXVar8 != (XMLCh *)0x0) && (*pXVar8 != L'\0')) {
            iVar5 = XMLString::indexOf(pXVar8,L':');
            pXVar9 = L"";
            if (1 < iVar5 + 1U) {
              (this->fBuffer).fIndex = 0;
              XMLBuffer::append(this_00,pXVar8,(long)iVar5);
              pXVar3 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
              iVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar6);
              pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
            }
            iVar5 = XMLString::indexOf(pXVar8,L':');
            lVar12 = 0;
            do {
              psVar1 = (short *)((long)pXVar8 + lVar12);
              lVar12 = lVar12 + 2;
            } while (*psVar1 != 0);
            count = (lVar12 >> 1) - 1;
            puVar14 = &XMLUni::fgZeroLenString;
            if (count != (long)(iVar5 + 1)) {
              if (iVar5 == -1) {
                this_00->fIndex = 0;
                pXVar11 = pXVar8;
              }
              else {
                count = count + ~(long)iVar5;
                this_00->fIndex = 0;
                pXVar11 = pXVar8 + (long)iVar5 + 1;
              }
              XMLBuffer::append(this_00,pXVar11,count);
              pXVar3 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
              iVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar6);
              puVar14 = (undefined2 *)CONCAT44(extraout_var_01,iVar5);
            }
            pXVar9 = resolvePrefixToURI(this,(DOMElement *)node,pXVar9);
            iVar5 = this->fTargetNSURI;
            iVar7 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                              (this->fURIStringPool,pXVar9);
            if (iVar5 == iVar7) {
              iVar5 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fStringPool,puVar14);
              iVar7 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fStringPool,redefineChildTypeName);
              if (iVar5 == iVar7) {
                this_00->fIndex = 0;
                if (*pXVar8 != L'\0') {
                  XMLBuffer::append(this_00,pXVar8);
                }
                iVar5 = redefineNameCounter;
                if (0 < redefineNameCounter) {
                  do {
                    XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
                (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
                (*node->_vptr_DOMNode[0x2c])(node,&SchemaSymbols::fgATT_REF);
                iVar13 = iVar13 + 1;
                if (redefineChildComponentName == L"group") {
LAB_0033527b:
                  pXVar8 = getElementAttValue(this,(DOMElement *)node,
                                              (XMLCh *)SchemaSymbols::fgATT_MINOCCURS,Decimal);
                  pXVar9 = getElementAttValue(this,(DOMElement *)node,
                                              (XMLCh *)SchemaSymbols::fgATT_MAXOCCURS,Decimal);
                  if ((pXVar9 == (XMLCh *)0x0) ||
                     (XVar4 = *pXVar9, pXVar9 == L"1" || XVar4 == L'\0')) {
LAB_003352cd:
                    if ((pXVar8 != (XMLCh *)0x0) &&
                       (XVar4 = *pXVar8, pXVar8 != L"1" && XVar4 != L'\0')) {
                      lVar12 = 0;
                      do {
                        lVar10 = lVar12;
                        if (XVar4 != *(XMLCh *)((long)&fgValueOne + lVar10)) goto LAB_0033532a;
                        XVar4 = *(XMLCh *)((long)pXVar8 + lVar10 + 2);
                        lVar12 = lVar10 + 2;
                      } while (XVar4 != L'\0');
                      if (*(short *)((long)&DAT_00368ef2 + lVar10) != 0) goto LAB_0033532a;
                    }
                  }
                  else {
                    lVar12 = 0;
                    do {
                      lVar10 = lVar12;
                      if (XVar4 != *(XMLCh *)((long)&fgValueOne + lVar10)) goto LAB_0033532a;
                      XVar4 = *(XMLCh *)((long)pXVar9 + lVar10 + 2);
                      lVar12 = lVar10 + 2;
                    } while (XVar4 != L'\0');
                    if (*(short *)((long)&DAT_00368ef2 + lVar10) == 0) goto LAB_003352cd;
LAB_0033532a:
                    reportSchemaError(this,(DOMElement *)node,
                                      L"http://apache.org/xml/messages/XMLErrors",0x7c,
                                      redefineChildTypeName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                  }
                }
                else {
                  pXVar8 = L"group";
                  if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_00335275:
                    if (*pXVar8 == L'\0') goto LAB_0033527b;
                  }
                  else {
                    pXVar8 = L"group";
                    pXVar9 = redefineChildComponentName;
                    do {
                      XVar4 = *pXVar9;
                      if (XVar4 == L'\0') goto LAB_00335275;
                      pXVar9 = pXVar9 + 1;
                      XVar2 = *pXVar8;
                      pXVar8 = pXVar8 + 1;
                    } while (XVar4 == XVar2);
                  }
                }
              }
            }
          }
        }
        else {
          pXVar9 = redefineChildComponentName;
          if ((redefineChildComponentName == (XMLCh *)0x0) || (pXVar8 == (XMLCh *)0x0)) {
            if (pXVar8 == (XMLCh *)0x0) {
              if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_00335025;
LAB_00335002:
              XVar4 = *pXVar9;
            }
            else {
              XVar4 = *pXVar8;
              if ((redefineChildComponentName != (XMLCh *)0x0) && (XVar4 == L'\0'))
              goto LAB_00335002;
            }
            if (XVar4 == L'\0') goto LAB_00335025;
          }
          else {
            do {
              XVar4 = *pXVar8;
              if (XVar4 == L'\0') goto LAB_00335002;
              pXVar8 = pXVar8 + 1;
              XVar2 = *pXVar9;
              pXVar9 = pXVar9 + 1;
            } while (XVar4 == XVar2);
          }
          iVar5 = changeRedefineGroup(this,(DOMElement *)node,redefineChildComponentName,
                                      redefineChildTypeName,redefineNameCounter);
          iVar13 = iVar13 + iVar5;
        }
      }
LAB_0033525c:
      node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
    } while (node != (DOMNode *)0x0);
  }
  return iVar13;
}

Assistant:

int TraverseSchema::changeRedefineGroup(const DOMElement* const redefineChildElem,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {
    int result = 0;
    DOMElement* child = XUtil::getFirstChildElement(redefineChildElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        if (!XMLString::equals(name, redefineChildComponentName)) {
            result += changeRedefineGroup(child, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
        } else {
            const XMLCh* refName = getElementAttValue(child, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);

            if (refName && *refName) {

                const XMLCh* prefix = getPrefix(refName);
                const XMLCh* localPart = getLocalPart(refName);
                const XMLCh* uriStr = resolvePrefixToURI(child, prefix);

                if (fTargetNSURI == (int) fURIStringPool->addOrFind(uriStr)
                    && fStringPool->addOrFind(localPart) == fStringPool->addOrFind(redefineChildTypeName)) {

                    // now we have to do the renaming...
                    getRedefineNewTypeName(refName, redefineNameCounter, fBuffer);
                    child->setAttribute(SchemaSymbols::fgATT_REF, fBuffer.getRawBuffer());
                    result++;

                    if(XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

                        const XMLCh* minOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MINOCCURS, DatatypeValidator::Decimal);
                        const XMLCh* maxOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MAXOCCURS, DatatypeValidator::Decimal);

                        if (((maxOccurs && *maxOccurs) && !XMLString::equals(maxOccurs, fgValueOne))
                            || ((minOccurs && *minOccurs) && !XMLString::equals(minOccurs, fgValueOne))) {
                            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidGroupMinMax, redefineChildTypeName);
                        }
                    }
                }
            } // if ref was null some other stage of processing will flag the error
        }
    }

    return result;
}